

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

int __thiscall NaVector::copy(NaVector *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint i;
  uint local_14;
  
  iVar1 = (*this->_vptr_NaVector[6])();
  iVar2 = (**(code **)(*(long *)dst + 0x30))();
  if (iVar1 != iVar2) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 2;
    __cxa_throw(puVar4,&NaException::typeinfo,0);
  }
  local_14 = 0;
  while( true ) {
    uVar3 = (*this->_vptr_NaVector[6])();
    if (uVar3 <= local_14) break;
    this->pVect[local_14] = *(NaReal *)(*(long *)(dst + 0x10) + (ulong)local_14 * 8);
    local_14 = local_14 + 1;
  }
  return (int)this;
}

Assistant:

NaVector&
NaVector::copy (const NaVector& rVect)
{
    if(dim() != rVect.dim()){
	throw(na_size_mismatch);
    }

    unsigned    i;
    for(i = 0; i < dim(); ++i)
        pVect[i] = rVect.pVect[i];

    return *this;
}